

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O2

int ibuf_write(msgbuf *msgbuf)

{
  size_t *psVar1;
  size_t sVar2;
  int *piVar3;
  ibuf *piVar4;
  ulong uVar5;
  iovec iov [1024];
  
  memset(iov,0,0x4000);
  psVar1 = &iov[0].iov_len;
  piVar4 = (ibuf *)msgbuf;
  for (uVar5 = 0;
      (piVar4 = ((anon_struct_16_2_f6afc105_for_bufs *)&piVar4->entry)->tqh_first,
      piVar4 != (ibuf *)0x0 && (uVar5 < 0x400)); uVar5 = uVar5 + 1) {
    sVar2 = piVar4->rpos;
    ((iovec *)(psVar1 + -1))->iov_base = piVar4->buf + sVar2;
    *psVar1 = piVar4->wpos - sVar2;
    psVar1 = psVar1 + 2;
  }
  do {
    sVar2 = writev(msgbuf->fd,(iovec *)iov,(int)uVar5);
    if (sVar2 != 0xffffffffffffffff) {
      if (sVar2 != 0) {
        msgbuf_drain(msgbuf,sVar2);
        return 1;
      }
      piVar3 = __errno_location();
      *piVar3 = 0;
      return 0;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (*piVar3 == 0x69) {
    *piVar3 = 0xb;
  }
  return -1;
}

Assistant:

int
ibuf_write(struct msgbuf *msgbuf)
{
	struct iovec	 iov[IOV_MAX];
	struct ibuf	*buf;
	unsigned int	 i = 0;
	ssize_t	n;

	bzero(&iov, sizeof(iov));
	TAILQ_FOREACH(buf, &msgbuf->bufs, entry) {
		if (i >= IOV_MAX)
			break;
		iov[i].iov_base = buf->buf + buf->rpos;
		iov[i].iov_len = buf->wpos - buf->rpos;
		i++;
	}

again:
	if ((n = writev(msgbuf->fd, iov, i)) == -1) {
		if (errno == EINTR)
			goto again;
		if (errno == ENOBUFS)
			errno = EAGAIN;
		return (-1);
	}

	if (n == 0) {			/* connection closed */
		errno = 0;
		return (0);
	}

	msgbuf_drain(msgbuf, n);

	return (1);
}